

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

Belief * __thiscall
despot::SimpleRockSample::InitialBelief(SimpleRockSample *this,State *start,string *type)

{
  bool bVar1;
  ParticleBelief *pPVar2;
  ostream *poVar3;
  vector<despot::State_*,_std::allocator<despot::State_*>_> particles;
  State *local_30;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_28;
  
  bVar1 = std::operator==(type,"DEFAULT");
  if (!bVar1) {
    bVar1 = std::operator==(type,"PARTICLE");
    if (!bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "[SimpleRockSample::InitialBelief] Unsupported belief type: ");
      poVar3 = std::operator<<(poVar3,(string *)type);
      std::endl<char,std::char_traits<char>>(poVar3);
      exit(1);
    }
  }
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30 = (State *)(**(code **)(*(long *)this + 0xa8))(0,this,0xffffffffffffffff);
  *(undefined8 *)(local_30 + 0x20) = 0x100000001;
  std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
            ((vector<despot::State*,std::allocator<despot::State*>> *)&particles,&local_30);
  local_30 = (State *)(**(code **)(*(long *)this + 0xa8))(0,this,0xffffffffffffffff);
  *(undefined8 *)(local_30 + 0x20) = 1;
  std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
            ((vector<despot::State*,std::allocator<despot::State*>> *)&particles,&local_30);
  pPVar2 = (ParticleBelief *)operator_new(0x90);
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
            ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_28,&particles);
  despot::ParticleBelief::ParticleBelief(pPVar2,&local_28,this,0,1);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_28);
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
            (&particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
  return (Belief *)pPVar2;
}

Assistant:

Belief* SimpleRockSample::InitialBelief(const State* start, string type) const {
	if (type == "DEFAULT" || type == "PARTICLE") {
		vector<State*> particles;

		SimpleState* good_rock = static_cast<SimpleState*>(Allocate(-1, 0.5));
		good_rock->rover_position = MIDDLE;
		good_rock->rock_status = O_GOOD;
		particles.push_back(good_rock);

		SimpleState* bad_rock = static_cast<SimpleState*>(Allocate(-1, 0.5));
		bad_rock->rover_position = MIDDLE;
		bad_rock->rock_status = O_BAD;
		particles.push_back(bad_rock);

		return new ParticleBelief(particles, this);
	} else {
		cerr << "[SimpleRockSample::InitialBelief] Unsupported belief type: " << type << endl;
		exit(1);
	}
}